

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

bool __thiscall Rml::DataInterpreter::Run(DataInterpreter *this)

{
  Instruction instruction;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined8 uVar5;
  Program *extraout_RDX;
  Program *extraout_RDX_00;
  Program *extraout_RDX_01;
  Program *extraout_RDX_02;
  Program *program;
  undefined1 local_48 [8];
  String program_str;
  size_t next_instruction;
  size_t i;
  bool success;
  DataInterpreter *this_local;
  
  bVar1 = true;
  next_instruction = 0;
  do {
    sVar3 = ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::size
                      (this->program);
    program = extraout_RDX;
    if (sVar3 <= next_instruction) {
LAB_004eeee5:
      if (bVar1 != false) {
        bVar2 = ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::empty(&this->stack);
        program = extraout_RDX_01;
        if (!bVar2) {
          sVar3 = ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::size(&this->stack);
          Log::Message(LT_WARNING,
                       "Possible data interpreter stack corruption. Stack size is %zu at end of execution (should be zero)."
                       ,sVar3);
          program = extraout_RDX_02;
        }
      }
      if (bVar1 == false) {
        DumpProgram_abi_cxx11_((String *)local_48,(Rml *)this->program,program);
        sVar3 = ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::size
                          (this->program);
        Log::Message(LT_WARNING,"Failed to execute program with %zu instructions:",sVar3);
        uVar5 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"%s",uVar5);
        ::std::__cxx11::string::~string((string *)local_48);
      }
      return bVar1;
    }
    program_str.field_2._8_8_ = next_instruction + 1;
    pvVar4 = ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::operator[]
                       (this->program,next_instruction);
    instruction = pvVar4->instruction;
    pvVar4 = ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::operator[]
                       (this->program,next_instruction);
    bVar2 = Execute(this,instruction,&pvVar4->data,(size_t *)(program_str.field_2._M_local_buf + 8))
    ;
    if (!bVar2) {
      bVar1 = false;
      program = extraout_RDX_00;
      goto LAB_004eeee5;
    }
    next_instruction = program_str.field_2._8_8_;
  } while( true );
}

Assistant:

bool Run()
	{
		bool success = true;
		size_t i = 0;
		while (i < program.size())
		{
			size_t next_instruction = i + 1;
			if (!Execute(program[i].instruction, program[i].data, next_instruction))
			{
				success = false;
				break;
			}
			i = next_instruction;
		}

		if (success && !stack.empty())
			Log::Message(Log::LT_WARNING, "Possible data interpreter stack corruption. Stack size is %zu at end of execution (should be zero).",
				stack.size());

		if (!success)
		{
			String program_str = DumpProgram(program);
			Log::Message(Log::LT_WARNING, "Failed to execute program with %zu instructions:", program.size());
			Log::Message(Log::LT_WARNING, "%s", program_str.c_str());
		}

		return success;
	}